

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWDSimulationDataGenerator.cpp
# Opt level: O1

void __thiscall SWDSimulationDataGenerator::OutputLineReset(SWDSimulationDataGenerator *this)

{
  int iVar1;
  
  iVar1 = 0x37;
  do {
    OutputWriteBit(this,BIT_HIGH);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  iVar1 = 10;
  do {
    OutputWriteBit(this,BIT_LOW);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  ClockGenerator::AdvanceByTimeS(4.9999999999999996e-06);
  SimulationChannelDescriptorGroup::AdvanceAll((int)this + 0x18);
  return;
}

Assistant:

void SWDSimulationDataGenerator::OutputLineReset()
{
    int cnt;

    // 55 ones
    for( cnt = 0; cnt < 55; ++cnt )
        OutputWriteBit( BIT_HIGH );

    // 10 zeros
    for( cnt = 0; cnt < 10; ++cnt )
        OutputWriteBit( BIT_LOW );

    // pause
    AdvanceAllBySec( TENTH_US * 50 );
}